

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

_Bool resolve_params(SolverParams *params,SolverDescriptor *desc,SolverTypedParams *out)

{
  TypedParam *pTVar1;
  ParamType type;
  char *__s2;
  FILE *pFVar2;
  _Bool _Var3;
  int iVar4;
  SolverTypedParamsEntry *pSVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  SolverDescriptor *pSVar9;
  long lVar10;
  char *val;
  uint uVar11;
  TypedParam t;
  
  solver_typed_params_destroy(out);
  lVar6 = 0;
  do {
    __s2 = desc[lVar6 * 4 + 1].name;
    if (__s2 == (char *)0x0) {
LAB_00104f07:
      return __s2 == (char *)0x0;
    }
    pSVar9 = desc + lVar6 * 4 + 1;
    uVar11 = params->num_params;
    if (0xff < (int)uVar11) {
      uVar11 = 0x100;
    }
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    val = (char *)0x0;
    for (lVar10 = 0; pFVar2 = _stderr, (ulong)uVar11 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
      pcVar7 = *(char **)((long)&params->params[0].name + lVar10);
      iVar4 = strcmp(pcVar7,__s2);
      if (iVar4 == 0) {
        if (val != (char *)0x0) {
          fprintf(_stderr,"ERROR: parameter `%s` specified twice or more.\n",pcVar7);
          goto LAB_00104efd;
        }
        val = *(char **)((long)&params->params[0].value + lVar10);
      }
    }
    if (val == (char *)0x0) {
      val = pSVar9[2].name;
    }
    t.field_2.dval = 0.0;
    type = *(ParamType *)&pSVar9[1].name;
    t._0_8_ = (ulong)type << 0x20;
    pcVar7 = __s2;
    if (val != (char *)0x0) {
      t.type = type;
      t.count = 1;
      pcVar7 = param_type_as_str(type);
      fprintf(pFVar2,"%s :: Setting `%s` (%s) to value `%s`\n","resolve_params",__s2,pcVar7,val);
      _Var3 = parse_solver_param_val(&t,val,*(ParamType *)&pSVar9[1].name);
      pFVar2 = _stderr;
      pcVar7 = pSVar9->name;
      if (!_Var3) {
        pcVar8 = param_type_as_str(*(ParamType *)&pSVar9[1].name);
        fprintf(pFVar2,"ERROR: Failed to parse param `%s=%s` required as a %s\n",pcVar7,val,pcVar8);
LAB_00104efd:
        solver_typed_params_destroy(out);
        goto LAB_00104f07;
      }
    }
    pSVar5 = (SolverTypedParamsEntry *)stbds_hmput_key(out->entries,0x18,pcVar7,8,1);
    out->entries = pSVar5;
    pTVar1 = &pSVar5[pSVar5[-2].value.field_2.sizeval].value;
    pTVar1->count = t.count;
    pTVar1->type = t.type;
    pTVar1->field_2 = t.field_2;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

bool resolve_params(const SolverParams *params, const SolverDescriptor *desc,
                    SolverTypedParams *out) {
    solver_typed_params_destroy(out);
    bool result = true;

    for (int32_t di = 0; desc->params[di].name != 0; di++) {
        const char *value = NULL;
        for (int32_t pi = 0;
             pi < MIN(MAX_NUM_SOLVER_PARAMS, params->num_params); pi++) {
            if (0 == strcmp(params->params[pi].name, desc->params[di].name)) {
                if (value) {
                    fprintf(stderr,
                            "ERROR: parameter `%s` specified twice or more.\n",
                            params->params[pi].name);
                    result = false;
                    goto terminate;
                }
                value = params->params[pi].value;
            }
        }

        // If the user didn't specify any value get the default value from the
        // descriptor
        if (!value) {
            value = desc->params[di].default_value;
        }

        // NOTE:
        // The descriptor may not contain a default_value: therefore
        // `value` may still be NULL
        TypedParam t = {0};
        t.type = desc->params[di].type;

        if (!value) {
            t.count = 0;
        } else {
            t.count = 1;

            fprintf(stderr, "%s :: Setting `%s` (%s) to value `%s`\n", __func__,
                    desc->params[di].name,
                    param_type_as_str(desc->params[di].type), value);

            if (!parse_solver_param_val(&t, value, desc->params[di].type)) {
                fprintf(
                    stderr,
                    "ERROR: Failed to parse param `%s=%s` required as a %s\n",
                    desc->params[di].name, value,
                    param_type_as_str(desc->params[di].type));
                result = false;
                goto terminate;
            }
        }

        shput(out->entries, desc->params[di].name, t);
    }

terminate:
    if (!result) {
        solver_typed_params_destroy(out);
    }
    return result;
}